

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRD2File.cpp
# Opt level: O3

void __thiscall BRD2File::BRD2File(BRD2File *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  vector<BRDPart,_std::allocator<BRDPart>_> *this_00;
  pointer *ppBVar3;
  string *psVar4;
  byte bVar5;
  pointer __src;
  iterator __position;
  _Hash_node_base *p_Var6;
  iterator __position_00;
  iterator __position_01;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  size_t __size;
  undefined8 uVar10;
  byte *pbVar11;
  int iVar12;
  char *pcVar13;
  int extraout_var;
  BRDPoint BVar14;
  BRDPoint extraout_RAX;
  BRDPoint extraout_RAX_00;
  BRDPoint extraout_RAX_01;
  BRDPoint extraout_RAX_02;
  undefined8 uVar15;
  long *plVar16;
  undefined8 *puVar17;
  BRDPoint *pBVar18;
  byte *pbVar19;
  long *plVar20;
  byte *pbVar21;
  long lVar22;
  size_t __n;
  BRDPartType BVar23;
  ulong uVar24;
  pointer ppcVar25;
  int iVar26;
  byte *pbVar27;
  int *piVar28;
  BRDPoint BVar29;
  BRDPoint BVar30;
  BRDPoint BVar31;
  BRDPoint BVar32;
  BRDPoint BVar33;
  BRDPoint BVar34;
  BRDPoint BVar35;
  BRDPoint BVar36;
  BRDPoint BVar37;
  BRDPoint BVar38;
  BRDPoint BVar39;
  BRDPoint BVar40;
  BRDPoint BVar41;
  BRDPoint BVar42;
  BRDPoint BVar43;
  BRDPoint BVar44;
  BRDPoint BVar45;
  BRDPoint BVar46;
  BRDPoint BVar47;
  BRDPoint BVar48;
  BRDPoint BVar49;
  BRDPoint BVar50;
  BRDPoint BVar51;
  BRDPoint BVar52;
  BRDPoint BVar53;
  BRDPoint BVar54;
  BRDPoint BVar55;
  BRDPoint BVar56;
  BRDPoint BVar57;
  BRDPoint BVar58;
  BRDPoint BVar59;
  BRDPoint BVar60;
  BRDPoint BVar61;
  BRDPoint BVar62;
  BRDPoint BVar63;
  BRDPoint BVar64;
  BRDPoint BVar65;
  BRDPoint BVar66;
  BRDPoint BVar67;
  BRDPoint BVar68;
  BRDPoint BVar69;
  BRDPoint BVar70;
  BRDPoint BVar71;
  BRDPoint BVar72;
  BRDPoint BVar73;
  BRDPoint BVar74;
  BRDPoint BVar75;
  BRDPoint BVar76;
  BRDPoint BVar77;
  BRDPoint BVar78;
  BRDPoint BVar79;
  BRDPoint BVar80;
  BRDPoint BVar81;
  BRDPoint BVar82;
  long lVar83;
  uint uVar84;
  BRDPartMountingSide *pBVar85;
  BRDFileBase *pBVar86;
  long lVar87;
  bool bVar88;
  uint uVar89;
  string __str;
  char *p;
  BRDPart part;
  BRDPoint point;
  char *arena;
  vector<char_*,_std::allocator<char_*>_> lines;
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  nets;
  BRDPoint local_260;
  BRDPoint local_258;
  BRDPoint local_250;
  BRDPoint *local_240;
  long local_238;
  BRDPoint local_230;
  long lStack_228;
  long *local_220;
  undefined8 local_218;
  long local_210;
  undefined8 uStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  BRDPoint *local_1a0;
  BRDPoint local_198;
  BRDPoint local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  byte *local_160;
  string *local_158;
  BRDFileBase *local_150;
  undefined1 local_148 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  char *pcStack_120;
  uint uStack_118;
  int iStack_114;
  int iStack_110;
  BRDPoint BStack_10c;
  BRDNail local_f8;
  BRDPoint local_d8;
  long local_d0;
  BRDPoint local_c8;
  int *local_c0;
  char *local_b8;
  char *local_b0;
  vector<char_*,_std::allocator<char_*>_> local_a8;
  vector<BRDNail,std::allocator<BRDNail>> *local_88;
  vector<BRDPoint,std::allocator<BRDPoint>> *local_80;
  vector<BRDPin,std::allocator<BRDPin>> *local_78;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_70;
  _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022b2d8;
  uVar24 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_150 = &this->super_BRDFileBase;
  if (4 < uVar24) {
    __size = (uVar24 + 1) * 3;
    pcVar13 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar13;
    if (pcVar13 != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar13,__src,__n);
      }
      pBVar86 = local_150;
      pcVar13[uVar24] = '\0';
      local_b0 = pcVar13 + uVar24 + 1;
      local_d8.x = 0;
      local_d8.y = 0;
      pcVar13[__size - 1] = '\0';
      local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(pcVar13,&local_a8);
      local_c0 = (int *)local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      if (local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_d0 = 0;
        uVar24 = 0;
      }
      else {
        local_b8 = pcVar13 + (__size - 1);
        local_88 = (vector<BRDNail,std::allocator<BRDNail>> *)&pBVar86->nails;
        local_158 = (string *)&pBVar86->error_msg;
        local_78 = (vector<BRDPin,std::allocator<BRDPin>> *)&pBVar86->pins;
        local_70 = &pBVar86->parts;
        local_80 = (vector<BRDPoint,std::allocator<BRDPoint>> *)&pBVar86->format;
        local_c8.x = 0;
        local_c8.y = 0;
        iVar26 = 0;
        local_d8.x = 0;
        local_d8.y = 0;
        local_d0 = 0;
        ppcVar25 = local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          pbVar19 = (byte *)*ppcVar25;
          pbVar27 = pbVar19 + -1;
          do {
            pbVar21 = pbVar27;
            pbVar19 = pbVar19 + 1;
            bVar5 = pbVar21[1];
            pbVar27 = pbVar21 + 1;
            BVar14.x = isspace((uint)bVar5);
            BVar14.y = extraout_var;
          } while (BVar14.x != 0);
          if (bVar5 != 0) {
            local_160 = pbVar27;
            iVar12 = strncmp((char *)pbVar27,"BRDOUT:",7);
            if (iVar12 == 0) {
              local_160 = pbVar21 + 8;
              lVar22 = strtol((char *)local_160,(char **)&local_160,10);
              if ((int)(uint)lVar22 < 0) {
                local_1a0 = &local_190;
                local_260.x = 0x7a;
                local_260.y = 0;
                pBVar18 = (BRDPoint *)
                          std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                BVar14 = local_260;
                local_190 = local_260;
                local_1a0 = pBVar18;
                memcpy(pBVar18,
                       "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                       ,0x7a);
                local_198 = BVar14;
                *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                pBVar18 = (BRDPoint *)(plVar16 + 2);
                if ((BRDPoint *)*plVar16 == pBVar18) {
                  local_230 = *pBVar18;
                  lStack_228 = plVar16[3];
                  local_240 = &local_230;
                }
                else {
                  local_230 = *pBVar18;
                  local_240 = (BRDPoint *)*plVar16;
                }
                local_238 = plVar16[1];
                *plVar16 = (long)pBVar18;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                local_260 = (BRDPoint)&local_250;
                std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                *(undefined2 *)local_260 = 0x3734;
                BVar29.x = 0xf;
                BVar29.y = 0;
                if (local_240 != &local_230) {
                  BVar29 = local_230;
                }
                if ((ulong)BVar29 < (ulong)((long)local_258 + local_238)) {
                  BVar30.x = 0xf;
                  BVar30.y = 0;
                  if (local_260 != (BRDPoint)&local_250) {
                    BVar30 = local_250;
                  }
                  if ((ulong)BVar30 < (ulong)((long)local_258 + local_238)) goto LAB_0012e14c;
                  puVar17 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                }
                else {
LAB_0012e14c:
                  puVar17 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                }
                plVar16 = puVar17 + 2;
                if ((long *)*puVar17 == plVar16) {
                  local_210 = *plVar16;
                  uStack_208 = puVar17[3];
                  local_220 = &local_210;
                }
                else {
                  local_210 = *plVar16;
                  local_220 = (long *)*puVar17;
                }
                local_218 = puVar17[1];
                *puVar17 = plVar16;
                puVar17[1] = 0;
                *(undefined1 *)plVar16 = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                local_200 = &local_1f0;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_1f0 = *plVar20;
                  lStack_1e8 = plVar16[3];
                }
                else {
                  local_1f0 = *plVar20;
                  local_200 = (long *)*plVar16;
                }
                local_1f8 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                local_1c0 = &local_1b0;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_1b0 = *plVar20;
                  lStack_1a8 = plVar16[3];
                }
                else {
                  local_1b0 = *plVar20;
                  local_1c0 = (long *)*plVar16;
                }
                local_1b8 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                local_1e0 = &local_1d0;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_1d0 = *plVar20;
                  lStack_1c8 = plVar16[3];
                }
                else {
                  local_1d0 = *plVar20;
                  local_1e0 = (long *)*plVar16;
                }
                local_1d8 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                local_180 = &local_170;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_170 = *plVar20;
                  lStack_168 = plVar16[3];
                }
                else {
                  local_170 = *plVar20;
                  local_180 = (long *)*plVar16;
                }
                local_178 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                BVar14 = (BRDPoint)(pBVar18 + 2);
                if (*pBVar18 == BVar14) {
                  local_148._16_8_ = *(undefined8 *)BVar14;
                  aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                  local_148._0_8_ = (long)local_148 + 0x10;
                }
                else {
                  local_148._16_8_ = *(undefined8 *)BVar14;
                  local_148._0_8_ = *pBVar18;
                }
                local_148._8_8_ = pBVar18[1];
                *pBVar18 = BVar14;
                pBVar18[1].x = 0;
                pBVar18[1].y = 0;
                *(undefined1 *)&pBVar18[2].x = 0;
                std::__cxx11::string::operator=(local_158,(string *)local_148);
                if (local_148._0_8_ != (long)local_148 + 0x10) {
                  operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                }
                if (local_180 != &local_170) {
                  operator_delete(local_180,local_170 + 1);
                }
                if (local_1e0 != &local_1d0) {
                  operator_delete(local_1e0,local_1d0 + 1);
                }
                if (local_1c0 != &local_1b0) {
                  operator_delete(local_1c0,local_1b0 + 1);
                }
                if (local_200 != &local_1f0) {
                  operator_delete(local_200,local_1f0 + 1);
                }
                if (local_220 != &local_210) {
                  operator_delete(local_220,local_210 + 1);
                }
                if (local_260 != (BRDPoint)&local_250) {
                  operator_delete((void *)local_260,(long)local_250 + 1);
                }
                if (local_240 != &local_230) {
                  operator_delete(local_240,(long)local_230 + 1);
                }
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,(long)local_190 + 1);
                }
                SDL_LogError(1,"%s",*(undefined8 *)local_158);
              }
              local_150->num_format = (uint)lVar22;
              local_d0 = strtol((char *)local_160,(char **)&local_160,10);
              local_d8 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
              BVar14 = local_d8;
            }
            else {
              iVar12 = strncmp((char *)pbVar27,"NETS:",5);
              if (iVar12 == 0) {
                local_160 = pbVar21 + 6;
                BVar14 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                iVar26 = 2;
                local_c8 = BVar14;
                if (-1 < BVar14.x) goto switchD_0012dbd5_default;
                local_1a0 = &local_190;
                local_260.x = 0x7a;
                local_260.y = 0;
                pBVar18 = (BRDPoint *)
                          std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                BVar14 = local_260;
                local_190 = local_260;
                local_1a0 = pBVar18;
                memcpy(pBVar18,
                       "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                       ,0x7a);
                local_198 = BVar14;
                *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                local_240 = &local_230;
                pBVar18 = (BRDPoint *)(plVar16 + 2);
                if ((BRDPoint *)*plVar16 == pBVar18) {
                  local_230 = *pBVar18;
                  lStack_228 = plVar16[3];
                }
                else {
                  local_230 = *pBVar18;
                  local_240 = (BRDPoint *)*plVar16;
                }
                local_238 = plVar16[1];
                *plVar16 = (long)pBVar18;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                local_260 = (BRDPoint)&local_250;
                std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                *(undefined2 *)local_260 = 0x3535;
                BVar31.x = 0xf;
                BVar31.y = 0;
                if (local_240 != &local_230) {
                  BVar31 = local_230;
                }
                if ((ulong)BVar31 < (ulong)((long)local_258 + local_238)) {
                  BVar32.x = 0xf;
                  BVar32.y = 0;
                  if (local_260 != (BRDPoint)&local_250) {
                    BVar32 = local_250;
                  }
                  if ((ulong)BVar32 < (ulong)((long)local_258 + local_238)) goto LAB_0012e5ef;
                  puVar17 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                }
                else {
LAB_0012e5ef:
                  puVar17 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                }
                plVar16 = puVar17 + 2;
                if ((long *)*puVar17 == plVar16) {
                  local_210 = *plVar16;
                  uStack_208 = puVar17[3];
                  local_220 = &local_210;
                }
                else {
                  local_210 = *plVar16;
                  local_220 = (long *)*puVar17;
                }
                local_218 = puVar17[1];
                *puVar17 = plVar16;
                puVar17[1] = 0;
                *(undefined1 *)plVar16 = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                local_200 = &local_1f0;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_1f0 = *plVar20;
                  lStack_1e8 = plVar16[3];
                }
                else {
                  local_1f0 = *plVar20;
                  local_200 = (long *)*plVar16;
                }
                local_1f8 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                local_1c0 = &local_1b0;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_1b0 = *plVar20;
                  lStack_1a8 = plVar16[3];
                }
                else {
                  local_1b0 = *plVar20;
                  local_1c0 = (long *)*plVar16;
                }
                local_1b8 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                local_1e0 = &local_1d0;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_1d0 = *plVar20;
                  lStack_1c8 = plVar16[3];
                }
                else {
                  local_1d0 = *plVar20;
                  local_1e0 = (long *)*plVar16;
                }
                local_1d8 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                local_180 = &local_170;
                plVar20 = plVar16 + 2;
                if ((long *)*plVar16 == plVar20) {
                  local_170 = *plVar20;
                  lStack_168 = plVar16[3];
                }
                else {
                  local_170 = *plVar20;
                  local_180 = (long *)*plVar16;
                }
                local_178 = plVar16[1];
                *plVar16 = (long)plVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                BVar14 = (BRDPoint)(pBVar18 + 2);
                if (*pBVar18 == BVar14) {
                  local_148._16_8_ = *(undefined8 *)BVar14;
                  aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                  local_148._0_8_ = (long)local_148 + 0x10;
                }
                else {
                  local_148._16_8_ = *(undefined8 *)BVar14;
                  local_148._0_8_ = *pBVar18;
                }
                local_148._8_8_ = pBVar18[1];
                *pBVar18 = BVar14;
                pBVar18[1].x = 0;
                pBVar18[1].y = 0;
                *(undefined1 *)&pBVar18[2].x = 0;
                std::__cxx11::string::operator=(local_158,(string *)local_148);
                if (local_148._0_8_ != (long)local_148 + 0x10) {
                  operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                }
                if (local_180 != &local_170) {
                  operator_delete(local_180,local_170 + 1);
                }
                if (local_1e0 != &local_1d0) {
                  operator_delete(local_1e0,local_1d0 + 1);
                }
                if (local_1c0 != &local_1b0) {
                  operator_delete(local_1c0,local_1b0 + 1);
                }
                if (local_200 != &local_1f0) {
                  operator_delete(local_200,local_1f0 + 1);
                }
                if (local_220 != &local_210) {
                  operator_delete(local_220,local_210 + 1);
                }
                if (local_260 != (BRDPoint)&local_250) {
                  operator_delete((void *)local_260,(long)local_250 + 1);
                }
                if (local_240 != &local_230) {
                  operator_delete(local_240,(long)local_230 + 1);
                }
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,(long)local_190 + 1);
                }
                BVar14 = (BRDPoint)SDL_LogError(1,"%s",*(undefined8 *)local_158);
                goto switchD_0012dbd5_default;
              }
              iVar12 = strncmp((char *)pbVar27,"PARTS:",6);
              if (iVar12 == 0) {
                local_160 = pbVar21 + 7;
                BVar14 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                pBVar86 = local_150;
                uVar89 = BVar14.x;
                if ((int)uVar89 < 0) {
                  local_1a0 = &local_190;
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3136;
                  BVar33.x = 0xf;
                  BVar33.y = 0;
                  if (local_240 != &local_230) {
                    BVar33 = local_230;
                  }
                  if ((ulong)BVar33 < (ulong)((long)local_258 + local_238)) {
                    BVar34.x = 0xf;
                    BVar34.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar34 = local_250;
                    }
                    if ((ulong)BVar34 < (ulong)((long)local_258 + local_238)) goto LAB_0012ea29;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012ea29:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  BVar14 = (BRDPoint)SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                pBVar86->num_parts = uVar89;
LAB_0012f042:
                iVar26 = 3;
                goto switchD_0012dbd5_default;
              }
              iVar12 = strncmp((char *)pbVar27,"PINS:",5);
              if (iVar12 == 0) {
                local_160 = pbVar21 + 6;
                BVar14 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                pBVar86 = local_150;
                uVar89 = BVar14.x;
                if ((int)uVar89 < 0) {
                  local_1a0 = &local_190;
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3736;
                  BVar35.x = 0xf;
                  BVar35.y = 0;
                  if (local_240 != &local_230) {
                    BVar35 = local_230;
                  }
                  if ((ulong)BVar35 < (ulong)((long)local_258 + local_238)) {
                    BVar36.x = 0xf;
                    BVar36.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar36 = local_250;
                    }
                    if ((ulong)BVar36 < (ulong)((long)local_258 + local_238)) goto LAB_0012f0e0;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012f0e0:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  BVar14 = (BRDPoint)SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                pBVar86->num_pins = uVar89;
LAB_0012f48b:
                iVar26 = 4;
                goto switchD_0012dbd5_default;
              }
              iVar12 = strncmp((char *)pbVar27,"NAILS:",6);
              pBVar86 = local_150;
              if (iVar12 == 0) {
                local_160 = pbVar21 + 7;
                BVar14 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                pBVar86 = local_150;
                uVar89 = BVar14.x;
                if ((int)uVar89 < 0) {
                  local_1a0 = &local_190;
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3337;
                  BVar37.x = 0xf;
                  BVar37.y = 0;
                  if (local_240 != &local_230) {
                    BVar37 = local_230;
                  }
                  if ((ulong)BVar37 < (ulong)((long)local_258 + local_238)) {
                    BVar38.x = 0xf;
                    BVar38.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar38 = local_250;
                    }
                    if ((ulong)BVar38 < (ulong)((long)local_258 + local_238)) goto LAB_0012f529;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012f529:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  BVar14 = (BRDPoint)SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                pBVar86->num_nails = uVar89;
LAB_0012f8d4:
                iVar26 = 5;
                goto switchD_0012dbd5_default;
              }
              BVar14.x = iVar26 - 1;
              BVar14.y = 0;
              switch(BVar14) {
              case (BRDPoint)0x0:
                if ((ulong)local_150->num_format <=
                    (ulong)((long)(local_150->format).
                                  super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(local_150->format).
                                  super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3)) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                    local_240 = &local_230;
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3937;
                  BVar45.x = 0xf;
                  BVar45.y = 0;
                  if (local_240 != &local_230) {
                    BVar45 = local_230;
                  }
                  if ((ulong)BVar45 < (ulong)((long)local_258 + local_238)) {
                    BVar46.x = 0xf;
                    BVar46.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar46 = local_250;
                    }
                    if ((ulong)BVar46 < (ulong)((long)local_258 + local_238)) goto LAB_0012fb69;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012fb69:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                local_f8.probe = 0;
                local_f8.pos.x = 0;
                lVar22 = strtol((char *)pbVar27,(char **)&local_160,10);
                local_f8.probe = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                local_f8.pos.x = (int)lVar22;
                iVar26 = (int)lVar22;
                if ((int)local_d0 < (int)local_f8.probe) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                    local_240 = &local_230;
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3338;
                  BVar55.x = 0xf;
                  BVar55.y = 0;
                  if (local_240 != &local_230) {
                    BVar55 = local_230;
                  }
                  if ((ulong)BVar55 < (ulong)((long)local_258 + local_238)) {
                    BVar56.x = 0xf;
                    BVar56.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar56 = local_250;
                    }
                    if ((ulong)BVar56 < (ulong)((long)local_258 + local_238)) goto LAB_00131249;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_00131249:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                  iVar26 = local_f8.pos.x;
                }
                if (local_d8.x < iVar26) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                    local_240 = &local_230;
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3438;
                  BVar59.x = 0xf;
                  BVar59.y = 0;
                  if (local_240 != &local_230) {
                    BVar59 = local_230;
                  }
                  if ((ulong)BVar59 < (ulong)((long)local_258 + local_238)) {
                    BVar60.x = 0xf;
                    BVar60.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar60 = local_250;
                    }
                    if ((ulong)BVar60 < (ulong)((long)local_258 + local_238)) goto LAB_00131bdb;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_00131bdb:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                __position._M_current =
                     (pBVar86->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pBVar86->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<BRDPoint,std::allocator<BRDPoint>>::_M_realloc_insert<BRDPoint_const&>
                            (local_80,__position,(BRDPoint *)&local_f8);
                  BVar14 = extraout_RAX;
                }
                else {
                  (__position._M_current)->x = local_f8.probe;
                  (__position._M_current)->y = local_f8.pos.x;
                  ppBVar1 = &(pBVar86->format).
                             super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  *ppBVar1 = *ppBVar1 + 1;
                  BVar14 = (BRDPoint)local_f8._0_8_;
                }
                break;
              case (BRDPoint)0x1:
                if (((ulong)local_c8 & 0xffffffff) <= local_68._M_element_count) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3938;
                  BVar47.x = 0xf;
                  BVar47.y = 0;
                  if (local_240 != &local_230) {
                    BVar47 = local_230;
                  }
                  if ((ulong)BVar47 < (ulong)((long)local_258 + local_238)) {
                    BVar48.x = 0xf;
                    BVar48.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar48 = local_250;
                    }
                    if ((ulong)BVar48 < (ulong)((long)local_258 + local_238)) goto LAB_0012fc0c;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012fc0c:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                lVar22 = strtol((char *)pbVar27,(char **)&local_160,10);
                if ((int)lVar22 < 0) {
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  local_1a0 = &local_190;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3039;
                  BVar57.x = 0xf;
                  BVar57.y = 0;
                  if (local_240 != &local_230) {
                    BVar57 = local_230;
                  }
                  if ((ulong)BVar57 < (ulong)((long)local_258 + local_238)) {
                    BVar58.x = 0xf;
                    BVar58.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar58 = local_250;
                    }
                    if ((ulong)BVar58 < (ulong)((long)local_258 + local_238)) goto LAB_00131735;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_00131735:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                pbVar19 = local_160;
                local_f8.probe = (int)lVar22;
                bVar5 = *local_160;
                pbVar27 = local_160;
                if (bVar5 != 0) {
                  iVar26 = isspace((uint)bVar5);
                  while (iVar26 != 0) {
                    pbVar19 = pbVar19 + 1;
                    bVar5 = *pbVar19;
                    pbVar27 = pbVar19;
                    if (bVar5 == 0) goto LAB_00132e43;
                    iVar26 = isspace((uint)bVar5);
                  }
                  local_160 = pbVar19;
                  iVar26 = isspace((uint)bVar5);
                  pbVar27 = pbVar19;
                  while (iVar26 == 0) {
                    pbVar27 = pbVar27 + 1;
                    if (*pbVar27 == 0) break;
                    iVar26 = isspace((uint)*pbVar27);
                  }
                }
LAB_00132e43:
                local_160 = pbVar27;
                *local_160 = 0;
                local_160 = local_160 + 1;
                pcVar13 = fix_to_utf8((char *)pbVar19,&local_b0,local_b8);
                BVar14 = (BRDPoint)
                         std::__detail::
                         _Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,(key_type *)&local_f8);
                *(char **)BVar14 = pcVar13;
                iVar26 = 2;
                goto switchD_0012dbd5_default;
              case (BRDPoint)0x2:
                if ((ulong)local_150->num_parts <=
                    (ulong)(((long)(local_150->parts).
                                   super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(local_150->parts).
                                   super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3539;
                  BVar41.x = 0xf;
                  BVar41.y = 0;
                  if (local_240 != &local_230) {
                    BVar41 = local_230;
                  }
                  if ((ulong)BVar41 < (ulong)((long)local_258 + local_238)) {
                    BVar42.x = 0xf;
                    BVar42.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar42 = local_250;
                    }
                    if ((ulong)BVar42 < (ulong)((long)local_258 + local_238)) goto LAB_0012fa1c;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012fa1c:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                local_148._0_4_ = 0;
                local_148._4_4_ = 0;
                local_148._8_8_ = &aStack_130;
                local_148._16_8_ = 0;
                aStack_130._M_allocated_capacity =
                     aStack_130._M_allocated_capacity & 0xffffffffffffff00;
                iStack_110 = 0;
                BStack_10c.x = 0;
                BStack_10c.y = 0;
                pcStack_120 = (char *)0x0;
                uStack_118 = 0;
                iStack_114 = 0;
                pbVar21 = pbVar27;
                pbVar11 = local_160;
                if (*pbVar27 != 0) {
                  iVar26 = isspace((uint)*pbVar27);
                  for (; (iVar26 != 0 && (pbVar27 = pbVar19, *pbVar19 != 0)); pbVar19 = pbVar19 + 1)
                  {
                    iVar26 = isspace((uint)*pbVar19);
                  }
                  pbVar21 = pbVar27;
                  pbVar11 = pbVar27;
                  if (*pbVar27 != 0) {
                    local_160 = pbVar27;
                    iVar26 = isspace((uint)*pbVar27);
                    while (pbVar11 = pbVar21, iVar26 == 0) {
                      pbVar21 = pbVar21 + 1;
                      pbVar11 = pbVar21;
                      if (*pbVar21 == 0) break;
                      iVar26 = isspace((uint)*pbVar21);
                    }
                  }
                }
                local_160 = pbVar11;
                *pbVar21 = 0;
                local_160 = local_160 + 1;
                local_148._0_8_ = fix_to_utf8((char *)pbVar27,&local_b0,local_b8);
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                iStack_114 = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                iStack_110 = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                BStack_10c.x = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                BStack_10c.y = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                if ((int)(uint)lVar22 < 0) {
                  local_260 = (BRDPoint)&local_250;
                  local_f8.probe = 0x7a;
                  local_f8.pos.x = 0;
                  BVar14 = (BRDPoint)
                           std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_f8);
                  uVar15 = local_f8._0_8_;
                  local_250.x = local_f8.probe;
                  local_250.y = local_f8.pos.x;
                  local_260 = BVar14;
                  memcpy((void *)BVar14,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  uVar10 = local_f8._0_8_;
                  local_f8.probe = (uint)uVar15;
                  local_f8.pos.x = SUB84(uVar15,4);
                  local_258.x = local_f8.probe;
                  local_258.y = local_f8.pos.x;
                  *(undefined1 *)((long)BVar14 + uVar15) = 0;
                  local_f8._0_8_ = uVar10;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_260);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_190 = *pBVar18;
                    lStack_188 = plVar16[3];
                    local_1a0 = &local_190;
                  }
                  else {
                    local_190 = *pBVar18;
                    local_1a0 = (BRDPoint *)*plVar16;
                  }
                  local_198 = *(BRDPoint *)(plVar16 + 1);
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_f8._0_8_ = &local_f8.net;
                  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,3,0x67);
                  BVar51.x = 0xf;
                  BVar51.y = 0;
                  if (local_1a0 != &local_190) {
                    BVar51 = local_190;
                  }
                  if ((ulong)BVar51 < (ulong)(local_f8._8_8_ + (long)local_198)) {
                    BVar52.x = 0xf;
                    BVar52.y = 0;
                    if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                      BVar52 = (BRDPoint)local_f8.net;
                    }
                    if ((ulong)BVar52 < (ulong)(local_f8._8_8_ + (long)local_198))
                    goto LAB_001307be;
                    plVar16 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1a0);
                  }
                  else {
LAB_001307be:
                    plVar16 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_1a0,local_f8._0_8_);
                  }
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)&pBVar18->x = 0;
                  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)(puVar17 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                    local_180 = &local_170;
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  std::__cxx11::string::operator=(local_158,(string *)&local_180);
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                    operator_delete((void *)local_f8._0_8_,(long)local_f8.net + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                pcStack_120 = (char *)((ulong)pcStack_120 & 0xffffffff);
                uStack_118 = (uint)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                iVar26 = (int)lVar22;
                if (iVar26 < 0) {
                  local_260 = (BRDPoint)&local_250;
                  local_f8.probe = 0x7a;
                  local_f8.pos.x = 0;
                  BVar14 = (BRDPoint)
                           std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_f8);
                  uVar15 = local_f8._0_8_;
                  local_250.x = local_f8.probe;
                  local_250.y = local_f8.pos.x;
                  local_260 = BVar14;
                  memcpy((void *)BVar14,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  uVar10 = local_f8._0_8_;
                  local_f8.probe = (uint)uVar15;
                  local_f8.pos.x = SUB84(uVar15,4);
                  local_258.x = local_f8.probe;
                  local_258.y = local_f8.pos.x;
                  *(undefined1 *)((long)BVar14 + uVar15) = 0;
                  local_f8._0_8_ = uVar10;
                  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                  pBVar18 = (BRDPoint *)(puVar17 + 2);
                  if ((BRDPoint *)*puVar17 == pBVar18) {
                    local_190 = *pBVar18;
                    lStack_188 = puVar17[3];
                    local_1a0 = &local_190;
                  }
                  else {
                    local_190 = *pBVar18;
                    local_1a0 = (BRDPoint *)*puVar17;
                  }
                  local_198 = *(BRDPoint *)(puVar17 + 1);
                  *puVar17 = pBVar18;
                  puVar17[1] = 0;
                  *(undefined1 *)(puVar17 + 2) = 0;
                  local_f8._0_8_ = &local_f8.net;
                  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,3,0x69);
                  BVar65.x = 0xf;
                  BVar65.y = 0;
                  if (local_1a0 != &local_190) {
                    BVar65 = local_190;
                  }
                  if ((ulong)BVar65 < (ulong)(local_f8._8_8_ + (long)local_198)) {
                    BVar66.x = 0xf;
                    BVar66.y = 0;
                    if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                      BVar66 = (BRDPoint)local_f8.net;
                    }
                    if ((ulong)BVar66 < (ulong)(local_f8._8_8_ + (long)local_198))
                    goto LAB_001333b5;
                    plVar16 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1a0);
                  }
                  else {
LAB_001333b5:
                    plVar16 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_1a0,local_f8._0_8_);
                  }
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)&pBVar18->x = 0;
                  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)(puVar17 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                    local_180 = &local_170;
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  std::__cxx11::string::operator=(local_158,(string *)&local_180);
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                    operator_delete((void *)local_f8._0_8_,(long)local_f8.net + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                uVar89 = (uint)(iVar26 == 2);
                if (iVar26 == 1) {
                  uVar89 = 2;
                }
                pcStack_120 = (char *)CONCAT44(pcStack_120._4_4_,uVar89);
                std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                          (local_70,(value_type *)local_148);
                BVar14 = (BRDPoint)&aStack_130;
                if ((BRDPoint)local_148._8_8_ != BVar14) {
                  operator_delete((void *)local_148._8_8_,
                                  (ulong)(aStack_130._M_allocated_capacity + 1));
                  BVar14 = extraout_RAX_01;
                }
                goto LAB_0012f042;
              case (BRDPoint)0x3:
                if ((ulong)local_150->num_pins <=
                    (ulong)(((long)(local_150->pins).
                                   super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(local_150->pins).
                                   super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x75);
                  BVar43.x = 0xf;
                  BVar43.y = 0;
                  if (local_240 != &local_230) {
                    BVar43 = local_230;
                  }
                  if ((ulong)BVar43 < (ulong)((long)local_258 + local_238)) {
                    BVar44.x = 0xf;
                    BVar44.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar44 = local_250;
                    }
                    if ((ulong)BVar44 < (ulong)((long)local_258 + local_238)) goto LAB_0012fac9;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012fac9:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                local_148._0_4_ = 0;
                local_148._4_4_ = 0;
                local_148._8_8_ = (pointer)0x0;
                local_148._16_8_ = local_148._16_8_ & 0xffffffff00000000;
                aStack_130._M_allocated_capacity = 0x1ea23f;
                aStack_130._8_8_ = 0.5;
                pcStack_120 = (char *)0x0;
                uStack_118 = 0;
                iStack_114 = 0;
                lVar22 = strtol((char *)pbVar27,(char **)&local_160,10);
                local_148._0_4_ = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                local_148._4_4_ = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                iVar26 = (int)lVar22;
                if (iVar26 < 0) {
                  local_260 = (BRDPoint)&local_250;
                  local_f8.probe = 0x7a;
                  local_f8.pos.x = 0;
                  BVar14 = (BRDPoint)
                           std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_f8);
                  uVar15 = local_f8._0_8_;
                  local_250.x = local_f8.probe;
                  local_250.y = local_f8.pos.x;
                  local_260 = BVar14;
                  memcpy((void *)BVar14,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  uVar10 = local_f8._0_8_;
                  local_f8.probe = (uint)uVar15;
                  local_f8.pos.x = SUB84(uVar15,4);
                  local_258.x = local_f8.probe;
                  local_258.y = local_f8.pos.x;
                  *(undefined1 *)((long)BVar14 + uVar15) = 0;
                  local_f8._0_8_ = uVar10;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_260);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_190 = *pBVar18;
                    lStack_188 = plVar16[3];
                    local_1a0 = &local_190;
                  }
                  else {
                    local_190 = *pBVar18;
                    local_1a0 = (BRDPoint *)*plVar16;
                  }
                  local_198 = *(BRDPoint *)(plVar16 + 1);
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_f8._0_8_ = &local_f8.net;
                  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,3,0x7a);
                  BVar53.x = 0xf;
                  BVar53.y = 0;
                  if (local_1a0 != &local_190) {
                    BVar53 = local_190;
                  }
                  if ((ulong)BVar53 < (ulong)(local_f8._8_8_ + (long)local_198)) {
                    BVar54.x = 0xf;
                    BVar54.y = 0;
                    if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                      BVar54 = (BRDPoint)local_f8.net;
                    }
                    if ((ulong)BVar54 < (ulong)(local_f8._8_8_ + (long)local_198))
                    goto LAB_00130d4f;
                    plVar16 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1a0);
                  }
                  else {
LAB_00130d4f:
                    plVar16 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_1a0,local_f8._0_8_);
                  }
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)&pBVar18->x = 0;
                  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)(puVar17 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                    local_180 = &local_170;
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  std::__cxx11::string::operator=(local_158,(string *)&local_180);
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                    operator_delete((void *)local_f8._0_8_,(long)local_f8.net + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                iVar12 = (int)lVar22;
                if (iVar12 < 0) {
                  local_260 = (BRDPoint)&local_250;
                  local_f8.probe = 0x7a;
                  local_f8.pos.x = 0;
                  BVar14 = (BRDPoint)
                           std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_f8);
                  uVar15 = local_f8._0_8_;
                  local_250.x = local_f8.probe;
                  local_250.y = local_f8.pos.x;
                  local_260 = BVar14;
                  memcpy((void *)BVar14,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  uVar10 = local_f8._0_8_;
                  local_f8.probe = (uint)uVar15;
                  local_f8.pos.x = SUB84(uVar15,4);
                  local_258.x = local_f8.probe;
                  local_258.y = local_f8.pos.x;
                  *(undefined1 *)((long)BVar14 + uVar15) = 0;
                  local_f8._0_8_ = uVar10;
                  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                  pBVar18 = (BRDPoint *)(puVar17 + 2);
                  if ((BRDPoint *)*puVar17 == pBVar18) {
                    local_190 = *pBVar18;
                    lStack_188 = puVar17[3];
                    local_1a0 = &local_190;
                  }
                  else {
                    local_190 = *pBVar18;
                    local_1a0 = (BRDPoint *)*puVar17;
                  }
                  local_198 = *(BRDPoint *)(puVar17 + 1);
                  *puVar17 = pBVar18;
                  puVar17[1] = 0;
                  *(undefined1 *)(puVar17 + 2) = 0;
                  local_f8._0_8_ = &local_f8.net;
                  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,3,0x7b);
                  BVar63.x = 0xf;
                  BVar63.y = 0;
                  if (local_1a0 != &local_190) {
                    BVar63 = local_190;
                  }
                  if ((ulong)BVar63 < (ulong)(local_f8._8_8_ + (long)local_198)) {
                    BVar64.x = 0xf;
                    BVar64.y = 0;
                    if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                      BVar64 = (BRDPoint)local_f8.net;
                    }
                    if ((ulong)BVar64 < (ulong)(local_f8._8_8_ + (long)local_198))
                    goto LAB_00132a18;
                    plVar16 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1a0);
                  }
                  else {
LAB_00132a18:
                    plVar16 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_1a0,local_f8._0_8_);
                  }
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                    local_240 = &local_230;
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)&pBVar18->x = 0;
                  puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)(puVar17 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                    local_180 = &local_170;
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  std::__cxx11::string::operator=(local_158,(string *)&local_180);
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if ((BRDPoint *)local_f8._0_8_ != (BRDPoint *)&local_f8.net) {
                    operator_delete((void *)local_f8._0_8_,(long)local_f8.net + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                uVar89 = (uint)(iVar12 == 2);
                if (iVar12 == 1) {
                  uVar89 = 2;
                }
                local_148._16_4_ = uVar89;
                if (local_68._M_buckets[(ulong)(long)iVar26 % local_68._M_bucket_count] ==
                    (__node_base_ptr)0x0) {
LAB_001345fc:
                  uVar15 = std::__throw_out_of_range("_Map_base::at");
                  if (local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_a8.
                                          super__Vector_base<char_*,_std::allocator<char_*>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_a8.
                                          super__Vector_base<char_*,_std::allocator<char_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&local_68);
                  BRDFileBase::~BRDFileBase(local_150);
                  _Unwind_Resume(uVar15);
                }
                p_Var6 = local_68._M_buckets[(ulong)(long)iVar26 % local_68._M_bucket_count]->_M_nxt
                ;
                iVar12 = *(int *)&p_Var6[1]._M_nxt;
                while (iVar12 != iVar26) {
                  p_Var6 = p_Var6->_M_nxt;
                  if ((p_Var6 == (_Hash_node_base *)0x0) ||
                     (iVar12 = *(int *)&p_Var6[1]._M_nxt,
                     (ulong)(long)iVar12 % local_68._M_bucket_count !=
                     (ulong)(long)iVar26 % local_68._M_bucket_count)) goto LAB_001345fc;
                }
                aStack_130._M_allocated_capacity = (size_type)p_Var6[2]._M_nxt;
                local_148._8_4_ = 1;
                local_148._12_4_ = 0;
                __position_00._M_current =
                     (local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
                            (local_78,__position_00,(BRDPin *)local_148);
                  BVar14 = extraout_RAX_00;
                }
                else {
                  BVar14.y = iStack_114;
                  BVar14.x = uStack_118;
                  (__position_00._M_current)->name = (char *)BVar14;
                  (__position_00._M_current)->radius = (double)aStack_130._8_8_;
                  (__position_00._M_current)->snum = pcStack_120;
                  *(undefined8 *)&(__position_00._M_current)->side = local_148._16_8_;
                  (__position_00._M_current)->net = (char *)aStack_130._M_allocated_capacity;
                  ((__position_00._M_current)->pos).x = local_148._0_4_;
                  ((__position_00._M_current)->pos).y = local_148._4_4_;
                  (__position_00._M_current)->probe = 1;
                  (__position_00._M_current)->part = 0;
                  ppBVar2 = &(local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppBVar2 = *ppBVar2 + 1;
                }
                goto LAB_0012f48b;
              case (BRDPoint)0x4:
                if ((ulong)local_150->num_nails <=
                    (ulong)(((long)(local_150->nails).
                                   super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(local_150->nails).
                                   super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
                  local_1a0 = &local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,"");
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                    local_240 = &local_230;
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x8f);
                  BVar39.x = 0xf;
                  BVar39.y = 0;
                  if (local_240 != &local_230) {
                    BVar39 = local_230;
                  }
                  if ((ulong)BVar39 < (ulong)((long)local_258 + local_238)) {
                    BVar40.x = 0xf;
                    BVar40.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar40 = local_250;
                    }
                    if ((ulong)BVar40 < (ulong)((long)local_258 + local_238)) goto LAB_0012f979;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012f979:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                local_f8.probe = 0;
                local_f8.pos.x = 0;
                local_f8.pos.y = 0;
                local_f8.side = Both;
                local_f8.net = "UNCONNECTED";
                lVar22 = strtol((char *)pbVar27,(char **)&local_160,10);
                if ((int)lVar22 < 0) {
                  local_1a0 = &local_190;
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                    local_240 = &local_230;
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x92);
                  BVar49.x = 0xf;
                  BVar49.y = 0;
                  if (local_240 != &local_230) {
                    BVar49 = local_230;
                  }
                  if ((ulong)BVar49 < (ulong)((long)local_258 + local_238)) {
                    BVar50.x = 0xf;
                    BVar50.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar50 = local_250;
                    }
                    if ((ulong)BVar50 < (ulong)((long)local_258 + local_238)) goto LAB_0013012b;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0013012b:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                local_f8.probe = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                local_f8.pos.x = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                local_f8.pos.y = (int)lVar22;
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                iVar26 = (int)lVar22;
                if (iVar26 < 0) {
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  local_1a0 = &local_190;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x95);
                  BVar61.x = 0xf;
                  BVar61.y = 0;
                  if (local_240 != &local_230) {
                    BVar61 = local_230;
                  }
                  if ((ulong)BVar61 < (ulong)((long)local_258 + local_238)) {
                    BVar62.x = 0xf;
                    BVar62.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar62 = local_250;
                    }
                    if ((ulong)BVar62 < (ulong)((long)local_258 + local_238)) goto LAB_001324fa;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_001324fa:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
                }
                if (local_68._M_buckets[(ulong)(long)iVar26 % local_68._M_bucket_count] !=
                    (__node_base_ptr)0x0) {
                  p_Var6 = local_68._M_buckets[(ulong)(long)iVar26 % local_68._M_bucket_count]->
                           _M_nxt;
                  iVar12 = *(int *)&p_Var6[1]._M_nxt;
                  do {
                    if (iVar12 == iVar26) {
                      local_f8.net = *(char **)(p_Var6 + 2);
                      goto LAB_00133803;
                    }
                    p_Var6 = p_Var6->_M_nxt;
                  } while ((p_Var6 != (_Hash_node_base *)0x0) &&
                          (iVar12 = *(int *)&p_Var6[1]._M_nxt,
                          (ulong)(long)iVar12 % local_68._M_bucket_count ==
                          (ulong)(long)iVar26 % local_68._M_bucket_count));
                }
                local_f8.net = "UNCONNECTED";
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Missing net id: ",0x10);
                plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar26);
                std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
                std::ostream::put((char)plVar16);
                std::ostream::flush();
LAB_00133803:
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                pBVar86 = local_150;
                if ((int)lVar22 < 0) {
                  local_1a0 = &local_190;
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  pBVar18 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_260);
                  BVar14 = local_260;
                  local_190 = local_260;
                  local_1a0 = pBVar18;
                  memcpy(pBVar18,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_198 = BVar14;
                  *(undefined1 *)((long)&pBVar18->x + (long)BVar14) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_240 = &local_230;
                  pBVar18 = (BRDPoint *)(plVar16 + 2);
                  if ((BRDPoint *)*plVar16 == pBVar18) {
                    local_230 = *pBVar18;
                    lStack_228 = plVar16[3];
                  }
                  else {
                    local_230 = *pBVar18;
                    local_240 = (BRDPoint *)*plVar16;
                  }
                  local_238 = plVar16[1];
                  *plVar16 = (long)pBVar18;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x9f);
                  BVar67.x = 0xf;
                  BVar67.y = 0;
                  if (local_240 != &local_230) {
                    BVar67 = local_230;
                  }
                  if ((ulong)BVar67 < (ulong)((long)local_258 + local_238)) {
                    BVar68.x = 0xf;
                    BVar68.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar68 = local_250;
                    }
                    if ((ulong)BVar68 < (ulong)((long)local_258 + local_238)) goto LAB_0013398d;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0013398d:
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  plVar16 = puVar17 + 2;
                  if ((long *)*puVar17 == plVar16) {
                    local_210 = *plVar16;
                    uStack_208 = puVar17[3];
                    local_220 = &local_210;
                  }
                  else {
                    local_210 = *plVar16;
                    local_220 = (long *)*puVar17;
                  }
                  local_218 = puVar17[1];
                  *puVar17 = plVar16;
                  puVar17[1] = 0;
                  *(undefined1 *)plVar16 = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1f0 = *plVar20;
                    lStack_1e8 = plVar16[3];
                  }
                  else {
                    local_1f0 = *plVar20;
                    local_200 = (long *)*plVar16;
                  }
                  local_1f8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
                  local_1c0 = &local_1b0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1b0 = *plVar20;
                    lStack_1a8 = plVar16[3];
                  }
                  else {
                    local_1b0 = *plVar20;
                    local_1c0 = (long *)*plVar16;
                  }
                  local_1b8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  local_1e0 = &local_1d0;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_1d0 = *plVar20;
                    lStack_1c8 = plVar16[3];
                  }
                  else {
                    local_1d0 = *plVar20;
                    local_1e0 = (long *)*plVar16;
                  }
                  local_1d8 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  local_180 = &local_170;
                  plVar20 = plVar16 + 2;
                  if ((long *)*plVar16 == plVar20) {
                    local_170 = *plVar20;
                    lStack_168 = plVar16[3];
                  }
                  else {
                    local_170 = *plVar20;
                    local_180 = (long *)*plVar16;
                  }
                  local_178 = plVar16[1];
                  *plVar16 = (long)plVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
                  BVar14 = (BRDPoint)(pBVar18 + 2);
                  if (*pBVar18 == BVar14) {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
                    local_148._0_8_ = (long)local_148 + 0x10;
                  }
                  else {
                    local_148._16_8_ = *(undefined8 *)BVar14;
                    local_148._0_8_ = *pBVar18;
                  }
                  local_148._8_8_ = pBVar18[1];
                  *pBVar18 = BVar14;
                  pBVar18[1].x = 0;
                  pBVar18[1].y = 0;
                  *(undefined1 *)&pBVar18[2].x = 0;
                  std::__cxx11::string::operator=(local_158,(string *)local_148);
                  if (local_148._0_8_ != (long)local_148 + 0x10) {
                    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,local_170 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,(long)local_190 + 1);
                  }
                  SDL_LogError(1,"%s",*(undefined8 *)local_158);
LAB_0013458d:
                  local_f8.side = 1;
                  local_f8.pos.y = local_d8.x - local_f8.pos.y;
                }
                else {
                  if ((int)lVar22 != 1) goto LAB_0013458d;
                  local_f8.side = 2;
                }
                __position_01._M_current =
                     (pBVar86->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position_01._M_current ==
                    (pBVar86->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<BRDNail,std::allocator<BRDNail>>::_M_realloc_insert<BRDNail_const&>
                            (local_88,__position_01,&local_f8);
                  BVar14 = extraout_RAX_02;
                }
                else {
                  (__position_01._M_current)->net = local_f8.net;
                  (__position_01._M_current)->probe = local_f8.probe;
                  ((__position_01._M_current)->pos).x = local_f8.pos.x;
                  *(undefined8 *)&((__position_01._M_current)->pos).y = local_f8._8_8_;
                  ppBVar3 = &(pBVar86->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppBVar3 = *ppBVar3 + 1;
                  BVar14 = (BRDPoint)local_f8.net;
                }
                goto LAB_0012f8d4;
              default:
                goto switchD_0012dbd5_default;
              }
            }
            iVar26 = 1;
          }
switchD_0012dbd5_default:
          ppcVar25 = ppcVar25 + 1;
        } while (ppcVar25 != (pointer)local_c0);
        uVar24 = (ulong)local_c8 & 0xffffffff;
        local_d0 = CONCAT71(BVar14._1_7_,iVar26 != 0);
        pBVar86 = local_150;
      }
      if ((long)(pBVar86->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pBVar86->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (ulong)pBVar86->num_format) {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        pBVar18 = (BRDPoint *)(plVar16 + 2);
        if ((BRDPoint *)*plVar16 == pBVar18) {
          local_230 = *pBVar18;
          lStack_228 = plVar16[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar18;
          local_240 = (BRDPoint *)*plVar16;
        }
        local_238 = plVar16[1];
        *plVar16 = (long)pBVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xad);
        BVar73.x = 0xf;
        BVar73.y = 0;
        if (local_240 != &local_230) {
          BVar73 = local_230;
        }
        if ((ulong)BVar73 < (ulong)((long)local_258 + local_238)) {
          BVar74.x = 0xf;
          BVar74.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar74 = local_250;
          }
          if ((ulong)BVar74 < (ulong)((long)local_258 + local_238)) goto LAB_00134cf9;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00134cf9:
          puVar17 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar16 = puVar17 + 2;
        if ((long *)*puVar17 == plVar16) {
          local_210 = *plVar16;
          uStack_208 = puVar17[3];
        }
        else {
          local_210 = *plVar16;
          local_220 = (long *)*puVar17;
        }
        local_218 = puVar17[1];
        *puVar17 = plVar16;
        puVar17[1] = 0;
        *(undefined1 *)plVar16 = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_200 = &local_1f0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1f0 = *plVar20;
          lStack_1e8 = plVar16[3];
        }
        else {
          local_1f0 = *plVar20;
          local_200 = (long *)*plVar16;
        }
        local_1f8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_1c0 = &local_1b0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1b0 = *plVar20;
          lStack_1a8 = plVar16[3];
        }
        else {
          local_1b0 = *plVar20;
          local_1c0 = (long *)*plVar16;
        }
        local_1b8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1e0 = &local_1d0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1d0 = *plVar20;
          lStack_1c8 = plVar16[3];
        }
        else {
          local_1d0 = *plVar20;
          local_1e0 = (long *)*plVar16;
        }
        local_1d8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_170 = *plVar20;
          lStack_168 = plVar16[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar20;
          local_180 = (long *)*plVar16;
        }
        local_178 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
        BVar14 = (BRDPoint)(pBVar18 + 2);
        if (*pBVar18 == BVar14) {
          local_148._16_8_ = *(undefined8 *)BVar14;
          aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
          local_148._0_8_ = (long)local_148 + 0x10;
        }
        else {
          local_148._16_8_ = *(undefined8 *)BVar14;
          local_148._0_8_ = *pBVar18;
        }
        local_148._8_8_ = pBVar18[1];
        *pBVar18 = BVar14;
        pBVar18[1].x = 0;
        pBVar18[1].y = 0;
        *(undefined1 *)&pBVar18[2].x = 0;
        psVar4 = &local_150->error_msg;
        std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
        if (local_148._0_8_ != (long)local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        pBVar86 = local_150;
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,(long)local_190 + 1);
        }
        SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
      }
      if (local_68._M_element_count != uVar24) {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        pBVar18 = (BRDPoint *)(plVar16 + 2);
        if ((BRDPoint *)*plVar16 == pBVar18) {
          local_230 = *pBVar18;
          lStack_228 = plVar16[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar18;
          local_240 = (BRDPoint *)*plVar16;
        }
        local_238 = plVar16[1];
        *plVar16 = (long)pBVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xae);
        BVar75.x = 0xf;
        BVar75.y = 0;
        if (local_240 != &local_230) {
          BVar75 = local_230;
        }
        if ((ulong)BVar75 < (ulong)((long)local_258 + local_238)) {
          BVar76.x = 0xf;
          BVar76.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar76 = local_250;
          }
          if ((ulong)BVar76 < (ulong)((long)local_258 + local_238)) goto LAB_00135504;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00135504:
          puVar17 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar16 = puVar17 + 2;
        if ((long *)*puVar17 == plVar16) {
          local_210 = *plVar16;
          uStack_208 = puVar17[3];
        }
        else {
          local_210 = *plVar16;
          local_220 = (long *)*puVar17;
        }
        local_218 = puVar17[1];
        *puVar17 = plVar16;
        puVar17[1] = 0;
        *(undefined1 *)plVar16 = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_200 = &local_1f0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1f0 = *plVar20;
          lStack_1e8 = plVar16[3];
        }
        else {
          local_1f0 = *plVar20;
          local_200 = (long *)*plVar16;
        }
        local_1f8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_1c0 = &local_1b0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1b0 = *plVar20;
          lStack_1a8 = plVar16[3];
        }
        else {
          local_1b0 = *plVar20;
          local_1c0 = (long *)*plVar16;
        }
        local_1b8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1e0 = &local_1d0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1d0 = *plVar20;
          lStack_1c8 = plVar16[3];
        }
        else {
          local_1d0 = *plVar20;
          local_1e0 = (long *)*plVar16;
        }
        local_1d8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_170 = *plVar20;
          lStack_168 = plVar16[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar20;
          local_180 = (long *)*plVar16;
        }
        local_178 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
        BVar14 = (BRDPoint)(pBVar18 + 2);
        if (*pBVar18 == BVar14) {
          local_148._16_8_ = *(undefined8 *)BVar14;
          aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
          local_148._0_8_ = (long)local_148 + 0x10;
        }
        else {
          local_148._16_8_ = *(undefined8 *)BVar14;
          local_148._0_8_ = *pBVar18;
        }
        local_148._8_8_ = pBVar18[1];
        *pBVar18 = BVar14;
        pBVar18[1].x = 0;
        pBVar18[1].y = 0;
        *(undefined1 *)&pBVar18[2].x = 0;
        psVar4 = &local_150->error_msg;
        std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
        if (local_148._0_8_ != (long)local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        pBVar86 = local_150;
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,(long)local_190 + 1);
        }
        SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
      }
      if (((long)(pBVar86->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pBVar86->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 -
          (ulong)pBVar86->num_parts != 0) {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        pBVar18 = (BRDPoint *)(plVar16 + 2);
        if ((BRDPoint *)*plVar16 == pBVar18) {
          local_230 = *pBVar18;
          lStack_228 = plVar16[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar18;
          local_240 = (BRDPoint *)*plVar16;
        }
        local_238 = plVar16[1];
        *plVar16 = (long)pBVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xaf);
        BVar77.x = 0xf;
        BVar77.y = 0;
        if (local_240 != &local_230) {
          BVar77 = local_230;
        }
        if ((ulong)BVar77 < (ulong)((long)local_258 + local_238)) {
          BVar78.x = 0xf;
          BVar78.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar78 = local_250;
          }
          if ((ulong)BVar78 < (ulong)((long)local_258 + local_238)) goto LAB_001359a3;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_001359a3:
          puVar17 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar16 = puVar17 + 2;
        if ((long *)*puVar17 == plVar16) {
          local_210 = *plVar16;
          uStack_208 = puVar17[3];
        }
        else {
          local_210 = *plVar16;
          local_220 = (long *)*puVar17;
        }
        local_218 = puVar17[1];
        *puVar17 = plVar16;
        puVar17[1] = 0;
        *(undefined1 *)plVar16 = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_200 = &local_1f0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1f0 = *plVar20;
          lStack_1e8 = plVar16[3];
        }
        else {
          local_1f0 = *plVar20;
          local_200 = (long *)*plVar16;
        }
        local_1f8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1b0 = *plVar20;
          lStack_1a8 = plVar16[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar20;
          local_1c0 = (long *)*plVar16;
        }
        local_1b8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1e0 = &local_1d0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1d0 = *plVar20;
          lStack_1c8 = plVar16[3];
        }
        else {
          local_1d0 = *plVar20;
          local_1e0 = (long *)*plVar16;
        }
        local_1d8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_170 = *plVar20;
          lStack_168 = plVar16[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar20;
          local_180 = (long *)*plVar16;
        }
        local_178 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
        BVar14 = (BRDPoint)(pBVar18 + 2);
        if (*pBVar18 == BVar14) {
          local_148._16_8_ = *(undefined8 *)BVar14;
          aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
          local_148._0_8_ = (long)local_148 + 0x10;
        }
        else {
          local_148._16_8_ = *(undefined8 *)BVar14;
          local_148._0_8_ = *pBVar18;
        }
        local_148._8_8_ = pBVar18[1];
        *pBVar18 = BVar14;
        pBVar18[1].x = 0;
        pBVar18[1].y = 0;
        *(undefined1 *)&pBVar18[2].x = 0;
        psVar4 = &local_150->error_msg;
        std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
        if (local_148._0_8_ != (long)local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        pBVar86 = local_150;
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,(long)local_190 + 1);
        }
        SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
      }
      if (((long)(pBVar86->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pBVar86->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 -
          (ulong)pBVar86->num_pins != 0) {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        pBVar18 = (BRDPoint *)(plVar16 + 2);
        if ((BRDPoint *)*plVar16 == pBVar18) {
          local_230 = *pBVar18;
          lStack_228 = plVar16[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar18;
          local_240 = (BRDPoint *)*plVar16;
        }
        local_238 = plVar16[1];
        *plVar16 = (long)pBVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xb0);
        BVar79.x = 0xf;
        BVar79.y = 0;
        if (local_240 != &local_230) {
          BVar79 = local_230;
        }
        if ((ulong)BVar79 < (ulong)((long)local_258 + local_238)) {
          BVar80.x = 0xf;
          BVar80.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar80 = local_250;
          }
          if ((ulong)BVar80 < (ulong)((long)local_258 + local_238)) goto LAB_00135e42;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00135e42:
          puVar17 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar16 = puVar17 + 2;
        if ((long *)*puVar17 == plVar16) {
          local_210 = *plVar16;
          uStack_208 = puVar17[3];
        }
        else {
          local_210 = *plVar16;
          local_220 = (long *)*puVar17;
        }
        local_218 = puVar17[1];
        *puVar17 = plVar16;
        puVar17[1] = 0;
        *(undefined1 *)plVar16 = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_200 = &local_1f0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1f0 = *plVar20;
          lStack_1e8 = plVar16[3];
        }
        else {
          local_1f0 = *plVar20;
          local_200 = (long *)*plVar16;
        }
        local_1f8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1b0 = *plVar20;
          lStack_1a8 = plVar16[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar20;
          local_1c0 = (long *)*plVar16;
        }
        local_1b8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1e0 = &local_1d0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1d0 = *plVar20;
          lStack_1c8 = plVar16[3];
        }
        else {
          local_1d0 = *plVar20;
          local_1e0 = (long *)*plVar16;
        }
        local_1d8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_170 = *plVar20;
          lStack_168 = plVar16[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar20;
          local_180 = (long *)*plVar16;
        }
        local_178 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
        BVar14 = (BRDPoint)(pBVar18 + 2);
        if (*pBVar18 == BVar14) {
          local_148._16_8_ = *(undefined8 *)BVar14;
          aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
          local_148._0_8_ = (long)local_148 + 0x10;
        }
        else {
          local_148._16_8_ = *(undefined8 *)BVar14;
          local_148._0_8_ = *pBVar18;
        }
        local_148._8_8_ = pBVar18[1];
        *pBVar18 = BVar14;
        pBVar18[1].x = 0;
        pBVar18[1].y = 0;
        *(undefined1 *)&pBVar18[2].x = 0;
        psVar4 = &local_150->error_msg;
        std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
        if (local_148._0_8_ != (long)local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        pBVar86 = local_150;
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,(long)local_190 + 1);
        }
        SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
      }
      if (((long)(pBVar86->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pBVar86->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
          (ulong)pBVar86->num_nails != 0) {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        pBVar18 = (BRDPoint *)(plVar16 + 2);
        if ((BRDPoint *)*plVar16 == pBVar18) {
          local_230 = *pBVar18;
          lStack_228 = plVar16[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar18;
          local_240 = (BRDPoint *)*plVar16;
        }
        local_238 = plVar16[1];
        *plVar16 = (long)pBVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xb1);
        BVar81.x = 0xf;
        BVar81.y = 0;
        if (local_240 != &local_230) {
          BVar81 = local_230;
        }
        if ((ulong)BVar81 < (ulong)((long)local_258 + local_238)) {
          BVar82.x = 0xf;
          BVar82.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar82 = local_250;
          }
          if ((ulong)BVar82 < (ulong)((long)local_258 + local_238)) goto LAB_001362e4;
          puVar17 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_001362e4:
          puVar17 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar16 = puVar17 + 2;
        if ((long *)*puVar17 == plVar16) {
          local_210 = *plVar16;
          uStack_208 = puVar17[3];
        }
        else {
          local_210 = *plVar16;
          local_220 = (long *)*puVar17;
        }
        local_218 = puVar17[1];
        *puVar17 = plVar16;
        puVar17[1] = 0;
        *(undefined1 *)plVar16 = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_200 = &local_1f0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1f0 = *plVar20;
          lStack_1e8 = plVar16[3];
        }
        else {
          local_1f0 = *plVar20;
          local_200 = (long *)*plVar16;
        }
        local_1f8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1b0 = *plVar20;
          lStack_1a8 = plVar16[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar20;
          local_1c0 = (long *)*plVar16;
        }
        local_1b8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1e0 = &local_1d0;
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_1d0 = *plVar20;
          lStack_1c8 = plVar16[3];
        }
        else {
          local_1d0 = *plVar20;
          local_1e0 = (long *)*plVar16;
        }
        local_1d8 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar20 = plVar16 + 2;
        if ((long *)*plVar16 == plVar20) {
          local_170 = *plVar20;
          lStack_168 = plVar16[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar20;
          local_180 = (long *)*plVar16;
        }
        local_178 = plVar16[1];
        *plVar16 = (long)plVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
        BVar14 = (BRDPoint)(pBVar18 + 2);
        if (*pBVar18 == BVar14) {
          local_148._16_8_ = *(undefined8 *)BVar14;
          aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
          local_148._0_8_ = (long)local_148 + 0x10;
        }
        else {
          local_148._16_8_ = *(undefined8 *)BVar14;
          local_148._0_8_ = *pBVar18;
        }
        local_148._8_8_ = pBVar18[1];
        *pBVar18 = BVar14;
        pBVar18[1].x = 0;
        pBVar18[1].y = 0;
        *(undefined1 *)&pBVar18[2].x = 0;
        psVar4 = &local_150->error_msg;
        std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
        if (local_148._0_8_ != (long)local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        pBVar86 = local_150;
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,(long)local_190 + 1);
        }
        SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
      }
      this_00 = &pBVar86->parts;
      pBVar7 = (pBVar86->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar22 = (long)(pBVar86->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pBVar7;
      if (lVar22 != 0) {
        lVar22 = (lVar22 >> 3) * -0x71c71c71c71c71c7;
        pBVar8 = (pBVar86->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar9 = (pBVar86->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_158 = (string *)&pBVar7[1].end_of_pins;
        local_c0 = &(pBVar8->pos).y;
        lVar83 = 0;
        uVar89 = 0;
        do {
          iVar26 = local_d8.x;
          if (pBVar7[lVar83].mounting_side == Bottom) {
            pBVar7[lVar83].p1.y = iVar26 - pBVar7[lVar83].p1.y;
            pBVar7[lVar83].p2.y = iVar26 - pBVar7[lVar83].p2.y;
          }
          uVar84 = (int)((ulong)((long)pBVar9 - (long)pBVar8) >> 3) * -0x49249249;
          if (lVar83 != lVar22 + -1) {
            uVar84 = *(uint *)((long)local_158 + lVar83 * 0x12 * 4);
          }
          if ((int)uVar89 < (int)uVar84) {
            pBVar85 = &(this_00->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar83].mounting_side;
            piVar28 = local_c0 + (long)(int)uVar89 * 0xe;
            lVar87 = (long)(int)uVar84 - (long)(int)uVar89;
            bVar88 = true;
            do {
              piVar28[2] = (int)lVar83 + 1;
              if (piVar28[3] == 2) {
                if (*pBVar85 == Top) {
LAB_0013676d:
                  bVar88 = false;
                }
              }
              else {
                *piVar28 = iVar26 - *piVar28;
                if ((piVar28[3] == 1) && (*pBVar85 == Bottom)) goto LAB_0013676d;
              }
              piVar28 = piVar28 + 0xe;
              lVar87 = lVar87 + -1;
            } while (lVar87 != 0);
            BVar23 = SMD;
            pBVar86 = local_150;
            uVar89 = uVar84;
            if (bVar88) goto LAB_0013678e;
          }
          else {
LAB_0013678e:
            pBVar7[lVar83].mounting_side = Both;
            BVar23 = ThroughHole;
            uVar84 = uVar89;
          }
          pBVar7[lVar83].part_type = BVar23;
          lVar83 = lVar83 + 1;
          uVar89 = uVar84;
        } while (lVar83 != lVar22 + (ulong)(lVar22 == 0));
      }
      iVar26 = 2;
      do {
        local_148._16_8_ = 0;
        aStack_130._M_allocated_capacity = aStack_130._M_allocated_capacity & 0xffffffffffffff00;
        iStack_110 = 0;
        BStack_10c.x = 0;
        BStack_10c.y = 0;
        uStack_118 = 0;
        iStack_114 = 0;
        local_148._0_8_ = (long)"Did you mean..." + 0xc;
        pcStack_120 = (char *)(ulong)((iVar26 != 2) + 1);
        local_148._8_8_ = &aStack_130;
        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(this_00,(value_type *)local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._8_8_ != &aStack_130) {
          operator_delete((void *)local_148._8_8_,(ulong)(aStack_130._M_allocated_capacity + 1));
        }
        iVar26 = iVar26 + -1;
      } while (iVar26 != 0);
      BRDFileBase::AddNailsAsPins(pBVar86);
      pBVar86->valid = SUB81(local_d0,0);
      if (local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_0013686c;
    }
    local_1a0 = &local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
               ,"");
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    pBVar18 = (BRDPoint *)(plVar16 + 2);
    if ((BRDPoint *)*plVar16 == pBVar18) {
      local_230 = *pBVar18;
      lStack_228 = plVar16[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *pBVar18;
      local_240 = (BRDPoint *)*plVar16;
    }
    local_238 = plVar16[1];
    *plVar16 = (long)pBVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    local_260 = (BRDPoint)&local_250;
    std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
    *(undefined2 *)local_260 = 0x3332;
    BVar71.x = 0xf;
    BVar71.y = 0;
    if (local_240 != &local_230) {
      BVar71 = local_230;
    }
    if ((ulong)BVar71 < (ulong)((long)local_258 + local_238)) {
      BVar72.x = 0xf;
      BVar72.y = 0;
      if (local_260 != (BRDPoint)&local_250) {
        BVar72 = local_250;
      }
      if ((ulong)BVar72 < (ulong)((long)local_258 + local_238)) goto LAB_00134c56;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
    }
    else {
LAB_00134c56:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
    }
    local_220 = &local_210;
    plVar16 = puVar17 + 2;
    if ((long *)*puVar17 == plVar16) {
      local_210 = *plVar16;
      uStack_208 = puVar17[3];
    }
    else {
      local_210 = *plVar16;
      local_220 = (long *)*puVar17;
    }
    local_218 = puVar17[1];
    *puVar17 = plVar16;
    puVar17[1] = 0;
    *(undefined1 *)plVar16 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_200 = &local_1f0;
    plVar20 = plVar16 + 2;
    if ((long *)*plVar16 == plVar20) {
      local_1f0 = *plVar20;
      lStack_1e8 = plVar16[3];
    }
    else {
      local_1f0 = *plVar20;
      local_200 = (long *)*plVar16;
    }
    local_1f8 = plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_1c0 = &local_1b0;
    plVar20 = plVar16 + 2;
    if ((long *)*plVar16 == plVar20) {
      local_1b0 = *plVar20;
      lStack_1a8 = plVar16[3];
    }
    else {
      local_1b0 = *plVar20;
      local_1c0 = (long *)*plVar16;
    }
    local_1b8 = plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_1e0 = &local_1d0;
    plVar20 = plVar16 + 2;
    if ((long *)*plVar16 == plVar20) {
      local_1d0 = *plVar20;
      lStack_1c8 = plVar16[3];
    }
    else {
      local_1d0 = *plVar20;
      local_1e0 = (long *)*plVar16;
    }
    local_1d8 = plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    plVar20 = plVar16 + 2;
    if ((long *)*plVar16 == plVar20) {
      local_170 = *plVar20;
      lStack_168 = plVar16[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar20;
      local_180 = (long *)*plVar16;
    }
    local_178 = plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
    BVar14 = (BRDPoint)(pBVar18 + 2);
    if (*pBVar18 == BVar14) {
      local_148._16_8_ = *(undefined8 *)BVar14;
      aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
      local_148._0_8_ = (long)local_148 + 0x10;
    }
    else {
      local_148._16_8_ = *(undefined8 *)BVar14;
      local_148._0_8_ = *pBVar18;
    }
    local_148._8_8_ = pBVar18[1];
    *pBVar18 = BVar14;
    pBVar18[1].x = 0;
    pBVar18[1].y = 0;
    *(undefined1 *)&pBVar18[2].x = 0;
    psVar4 = &local_150->error_msg;
    std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
    if (local_148._0_8_ != (long)local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != (BRDPoint)&local_250) {
      operator_delete((void *)local_260,(long)local_250 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,(long)local_230 + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,(long)local_190 + 1);
    }
    SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
    goto LAB_0013686c;
  }
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
             ,"");
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  pBVar18 = (BRDPoint *)(plVar16 + 2);
  if ((BRDPoint *)*plVar16 == pBVar18) {
    local_230 = *pBVar18;
    lStack_228 = plVar16[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *pBVar18;
    local_240 = (BRDPoint *)*plVar16;
  }
  local_238 = plVar16[1];
  *plVar16 = (long)pBVar18;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_260 = (BRDPoint)&local_250;
  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
  *(undefined2 *)local_260 = 0x3032;
  BVar69.x = 0xf;
  BVar69.y = 0;
  if (local_240 != &local_230) {
    BVar69 = local_230;
  }
  if ((ulong)BVar69 < (ulong)((long)local_258 + local_238)) {
    BVar70.x = 0xf;
    BVar70.y = 0;
    if (local_260 != (BRDPoint)&local_250) {
      BVar70 = local_250;
    }
    if ((ulong)BVar70 < (ulong)((long)local_258 + local_238)) goto LAB_001347bc;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_001347bc:
    puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
  }
  local_220 = &local_210;
  plVar16 = puVar17 + 2;
  if ((long *)*puVar17 == plVar16) {
    local_210 = *plVar16;
    uStack_208 = puVar17[3];
  }
  else {
    local_210 = *plVar16;
    local_220 = (long *)*puVar17;
  }
  local_218 = puVar17[1];
  *puVar17 = plVar16;
  puVar17[1] = 0;
  *(undefined1 *)plVar16 = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_200 = &local_1f0;
  plVar20 = plVar16 + 2;
  if ((long *)*plVar16 == plVar20) {
    local_1f0 = *plVar20;
    lStack_1e8 = plVar16[3];
  }
  else {
    local_1f0 = *plVar20;
    local_200 = (long *)*plVar16;
  }
  local_1f8 = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_200);
  plVar20 = plVar16 + 2;
  if ((long *)*plVar16 == plVar20) {
    local_1b0 = *plVar20;
    lStack_1a8 = plVar16[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *plVar20;
    local_1c0 = (long *)*plVar16;
  }
  local_1b8 = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_1e0 = &local_1d0;
  plVar20 = plVar16 + 2;
  if ((long *)*plVar16 == plVar20) {
    local_1d0 = *plVar20;
    lStack_1c8 = plVar16[3];
  }
  else {
    local_1d0 = *plVar20;
    local_1e0 = (long *)*plVar16;
  }
  local_1d8 = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  plVar20 = plVar16 + 2;
  if ((long *)*plVar16 == plVar20) {
    local_170 = *plVar20;
    lStack_168 = plVar16[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar20;
    local_180 = (long *)*plVar16;
  }
  local_178 = plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_180);
  BVar14 = (BRDPoint)(pBVar18 + 2);
  if (*pBVar18 == BVar14) {
    local_148._16_8_ = *(undefined8 *)BVar14;
    aStack_130._M_allocated_capacity = (size_type)pBVar18[3];
    local_148._0_8_ = (long)local_148 + 0x10;
  }
  else {
    local_148._16_8_ = *(undefined8 *)BVar14;
    local_148._0_8_ = *pBVar18;
  }
  local_148._8_8_ = pBVar18[1];
  *pBVar18 = BVar14;
  pBVar18[1].x = 0;
  pBVar18[1].y = 0;
  *(undefined1 *)&pBVar18[2].x = 0;
  psVar4 = &local_150->error_msg;
  std::__cxx11::string::operator=((string *)psVar4,(string *)local_148);
  if (local_148._0_8_ != (long)local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_260 != (BRDPoint)&local_250) {
    operator_delete((void *)local_260,(long)local_250 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,(long)local_230 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,(long)local_190 + 1);
  }
  SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
LAB_0013686c:
  std::
  _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

BRD2File::BRD2File(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	std::unordered_map<int, char *> nets; // Map between net id and net name
	unsigned int num_nets = 0;
	BRDPoint max{0, 0}; // Top-right board boundary

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *>  lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (strstr(line, "BRDOUT:") == line) {
			current_block = 1;
			p += 7; // Skip "BRDOUT:"
			num_format = READ_UINT();
			max.x      = READ_INT();
			max.y      = READ_INT();
			continue;
		}
		if (strstr(line, "NETS:") == line) {
			current_block = 2;
			p += 5; // Skip "NETS:"
			num_nets = READ_UINT();
			continue;
		}
		if (strstr(line, "PARTS:") == line) {
			current_block = 3;
			p += 6; // Skip "PARTS:"
			num_parts = READ_UINT();
			continue;
		}
		if (strstr(line, "PINS:") == line) {
			current_block = 4;
			p += 5; // Skip "PINS:"
			num_pins = READ_UINT();
			continue;
		}
		if (strstr(line, "NAILS:") == line) {
			current_block = 5;
			p += 6; // Skip "NAILS:"
			num_nails = READ_UINT();
			continue;
		}

		switch (current_block) {
			case 1: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint point;
				point.x = READ_INT();
				point.y = READ_INT();
				ENSURE(point.x <= max.x, error_msg);
				ENSURE(point.y <= max.y, error_msg);
				format.push_back(point);
			} break;

			case 2: { // Nets
				ENSURE(nets.size() < num_nets, error_msg);
				int id   = READ_UINT();
				nets[id] = READ_STR();
			} break;

			case 3: { // PARTS
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;

				part.name        = READ_STR();
				part.p1.x        = READ_INT();
				part.p1.y        = READ_INT();
				part.p2.x        = READ_INT();
				part.p2.y        = READ_INT();
				part.end_of_pins = READ_UINT(); // Warning: not end but beginning in this format
				part.part_type   = BRDPartType::SMD;
				int side         = READ_UINT();
				if (side == 1)
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else if (side == 2)
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				else //0
					part.mounting_side = BRDPartMountingSide::Both;

				parts.push_back(part);
			} break;

			case 4: { // PINS
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;

				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				int netid = READ_UINT();
				unsigned int side  = READ_UINT();
				if (side == 1)
					pin.side = BRDPinSide::Top;
				else if (side == 2)
					pin.side = BRDPinSide::Bottom;
				else //0
					pin.side = BRDPinSide::Both;

				try {
					pin.net = nets.at(netid);
				} catch (const std::out_of_range &e) {
					pin.net = "";
				}

				pin.probe = 1;
				pin.part  = 0;
				pins.push_back(pin);
			} break;

			case 5: { // NAILS
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;

				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				int netid  = READ_UINT();

				auto inet = nets.find(netid);
				if (inet != nets.end())
					nail.net = inet->second;
				else {
					nail.net = "UNCONNECTED";
					std::cerr << "Missing net id: " << netid << std::endl;
				}

				bool nail_is_top = READ_UINT() == 1;
				if (nail_is_top) {
					nail.side = BRDPartMountingSide::Top;
				} else {
					nail.side = BRDPartMountingSide::Bottom;
					nail.pos.y = max.y - nail.pos.y;
				}
				nails.push_back(nail);

			} break;
			default: continue;
		}
	}

	ENSURE(num_format == format.size(), error_msg);
	ENSURE(num_nets == nets.size(), error_msg);
	ENSURE(num_parts == parts.size(), error_msg);
	ENSURE(num_pins == pins.size(), error_msg);
	ENSURE(num_nails == nails.size(), error_msg);

	/*
	 * Postprocess the data.  Specifically we need to allocate
	 * pins to parts.  So with this it's easiest to just iterate
	 * through the parts and pick up the pins required
	 */
	{
		int pei;     // pin end index (part[i+1].pin# -1
		int cpi = 0; // current pin index
		for (decltype(parts)::size_type i = 0; i < parts.size(); i++) {
			bool isDIP = true;

			if (parts[i].mounting_side == BRDPartMountingSide::Bottom) { // Part on bottom
				parts[i].p1.y = max.y - parts[i].p1.y;
				parts[i].p2.y = max.y - parts[i].p2.y;
			}

			if (i == parts.size() - 1) {
				pei = pins.size();
			} else {
				pei = parts[i + 1].end_of_pins; // Again, not end of pins but beginning
			}

			while (cpi < pei) {
				pins[cpi].part                           = i + 1;
				if (pins[cpi].side != BRDPinSide::Top) pins[cpi].pos.y = max.y - pins[cpi].pos.y;
				if ((pins[cpi].side == BRDPinSide::Top && parts[i].mounting_side == BRDPartMountingSide::Top) ||
				    (pins[cpi].side == BRDPinSide::Bottom && parts[i].mounting_side == BRDPartMountingSide::Bottom)) {
					// Pins on the same side as the part
					isDIP = false;
				}
				cpi++;
			}

			if (isDIP) {
				// All pins are through hole so part is DIP
				parts[i].part_type     = BRDPartType::ThroughHole;
				parts[i].mounting_side = BRDPartMountingSide::Both;
			} else {
				parts[i].part_type = BRDPartType::SMD;
			}
		}
	}

	for (auto i = 1; i <= 2; i++) { // Add dummy parts for probe points on both sides
		BRDPart part;
		part.name = "...";
		part.mounting_side =
		    (i == 1 ? BRDPartMountingSide::Bottom : BRDPartMountingSide::Top); // First part is bottom, last is top.
		part.end_of_pins = 0;                                                  // Unused
		parts.push_back(part);
	}

	AddNailsAsPins();

	valid = current_block != 0;
}